

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iterator_file.c
# Opt level: O3

mpt_metatype * mpt_iterator_filename(char *name)

{
  size_t sVar1;
  FILE *pFVar2;
  mpt_metatype *pmVar3;
  int *piVar4;
  
  if (name != (char *)0x0) {
    sVar1 = strlen(name);
    if ((int)sVar1 != 0) {
      pFVar2 = fopen(name,"r");
      if (pFVar2 == (FILE *)0x0) {
        return (mpt_metatype *)0x0;
      }
      pmVar3 = (mpt_metatype *)malloc((long)(int)sVar1 + 0x61);
      if (pmVar3 == (mpt_metatype *)0x0) {
        return (mpt_metatype *)0x0;
      }
      pmVar3->_vptr = (_mpt_vptr_metatype *)fileInit_fileMeta;
      pmVar3[1]._vptr = (_mpt_vptr_metatype *)fileInit_fileIter;
      pmVar3[2]._vptr = (_mpt_vptr_metatype *)0x1;
      pmVar3[3]._vptr = (_mpt_vptr_metatype *)&fileInit_fileElem;
      pmVar3[4]._vptr = (_mpt_vptr_metatype *)(pmVar3 + 3);
      pmVar3[5]._vptr = (_mpt_vptr_metatype *)(pmVar3 + 4);
      pmVar3[6]._vptr = (_mpt_vptr_metatype *)0x80;
      pmVar3[9]._vptr = (_mpt_vptr_metatype *)0x0;
      pmVar3[7]._vptr = (_mpt_vptr_metatype *)pFVar2;
      memcpy((_mpt_vptr_metatype *)(pmVar3 + 0xc),name,(long)((sVar1 << 0x20) + 0x100000000) >> 0x20
            );
      pmVar3[8]._vptr = (_mpt_vptr_metatype *)(pmVar3 + 0xc);
      return pmVar3;
    }
  }
  piVar4 = __errno_location();
  *piVar4 = 0x16;
  return (mpt_metatype *)0x0;
}

Assistant:

extern MPT_INTERFACE(metatype) *mpt_iterator_filename(const char *name)
{
	MPT_STRUCT(iteratorFile) *data;
	FILE *file;
	int len;
	
	if (!name || !(len = strlen(name))) {
		errno = EINVAL;
		return 0;
	}
	if (!(file = fopen(name, "r"))) {
		return 0;
	}
	if (!(data = malloc(sizeof(*data) + len + 1))) {
		return 0;
	}
	fileInit(data);
	data->fd = file;
	data->name = memcpy(data + 1, name, len + 1);
	
	return &data->_mt;
}